

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void gen_gvec_op2i(DisasContext_conflict1 *s,_Bool is_q,int rd,int rn,int64_t imm,
                  GVecGen2i_conflict1 *gvec_op)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t oprsz;
  uint32_t maxsz;
  TCGContext_conflict1 *tcg_ctx;
  GVecGen2i_conflict1 *gvec_op_local;
  int64_t imm_local;
  int rn_local;
  int rd_local;
  _Bool is_q_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  dofs = vec_full_reg_offset(s,rd);
  aofs = vec_full_reg_offset(s,rn);
  oprsz = 8;
  if (is_q) {
    oprsz = 0x10;
  }
  maxsz = vec_full_reg_size(s);
  tcg_gen_gvec_2i_aarch64(tcg_ctx_00,dofs,aofs,oprsz,maxsz,imm,gvec_op);
  return;
}

Assistant:

static void gen_gvec_op2i(DisasContext *s, bool is_q, int rd,
                          int rn, int64_t imm, const GVecGen2i *gvec_op)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_gvec_2i(tcg_ctx, vec_full_reg_offset(s, rd), vec_full_reg_offset(s, rn),
                    is_q ? 16 : 8, vec_full_reg_size(s), imm, gvec_op);
}